

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

int __thiscall CVmObjTads::is_instance_of(CVmObjTads *this,vm_obj_id_t obj)

{
  int iVar1;
  tadsobj_sc_search_ctx curpos;
  tadsobj_sc_search_ctx local_30;
  
  local_30.cur = 0;
  local_30.curhdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  local_30.path_sc = (tadsobj_objid_and_ptr *)0x0;
  do {
    iVar1 = tadsobj_sc_search_ctx::to_next(&local_30);
    if (iVar1 == 0) {
      iVar1 = CVmObject::is_instance_of(&this->super_CVmObject,obj);
      return iVar1;
    }
  } while (local_30.cur != obj);
  return 1;
}

Assistant:

int CVmObjTads::is_instance_of(VMG_ vm_obj_id_t obj)
{
    /* 
     *   Set up a superclass search position.  Since the first thing we'll
     *   do is call 'to_next', and since 'to_next' doesn't require a valid
     *   current object ID (only a valid 'this' pointer), we don't need to
     *   know our own object ID - simply set the initial object ID to the
     *   invalid ID.  
     */
    tadsobj_sc_search_ctx curpos(vmg_ VM_INVALID_OBJ, this);
    
    /* 
     *   scan through the search list, comparing each superclass to the
     *   object of interest; if we find it among our superclasses, we're an
     *   instance of the given object 
     */
    for (;;)
    {
        /* skip to the next object */
        if (!curpos.to_next(vmg0_))
        {
            /* we've run out of superclasses without finding it */
            break;
        }
        
        /* 
         *   if the current superclass is the object we're looking for, then
         *   we're an instance of that object 
         */
        if (curpos.cur == obj)
            return TRUE;
    }

    /* 
     *   None of our superclasses match the given object, and none of the
     *   superclasses derive from the given object, so we must not derive
     *   from the given object.  Our last recourse is to determine if the
     *   object represents our metaclass; inherit the default handling to
     *   make this check.  
     */
    return CVmObject::is_instance_of(vmg_ obj);
}